

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unicode_filenames.cc
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *this;
  char *f2;
  char *f1;
  char **argv_local;
  int argc_local;
  
  copy((EVP_PKEY_CTX *)anon_var_dwarf_6cc,(EVP_PKEY_CTX *)argv);
  copy((EVP_PKEY_CTX *)anon_var_dwarf_6d6,(EVP_PKEY_CTX *)argv);
  this = std::operator<<((ostream *)&std::cout,"created Unicode filenames");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    // Explicit UTF-8 encoding
    char const* f1 = "auto-\xc3\xbc.pdf";
    char const* f2 = "auto-\xc3\xb6\xcf\x80.pdf";
    copy(f1);
    copy(f2);
    std::cout << "created Unicode filenames" << std::endl;
    return 0;
}